

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

void ppc_release(void *ctx)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  
  lVar1 = *(long *)(*(long *)((long)ctx + 0x8970) + 0x1a0);
  release_common(ctx);
  puVar3 = (undefined8 *)(lVar1 + 0x8490);
  for (lVar2 = 0; lVar2 != 0xa0; lVar2 = lVar2 + 0x10) {
    g_free((gpointer)*puVar3);
    g_free(*(gpointer *)(lVar1 + 0x9d18 + lVar2));
    puVar3 = puVar3 + 0x57;
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    g_free(*(gpointer *)((long)ctx + lVar2 * 8 + 0x8bd0));
  }
  g_free(*(gpointer *)((long)ctx + 0x9008));
  g_free(*(gpointer *)((long)ctx + 0x9010));
  g_free(*(gpointer *)((long)ctx + 0x9000));
  if ((*(int *)(lVar1 + 0xa888) != 0) && (*(int *)(lVar1 + 0xa8a0) - 1U < 3)) {
    g_free(*(gpointer *)(lVar1 + 0xa8a8));
  }
  ppc_cpu_instance_finalize_ppc64(*(CPUState **)(*(long *)((long)ctx + 0x8970) + 0x1a0));
  ppc_cpu_unrealize_ppc64(*(CPUState **)(*(long *)((long)ctx + 0x8970) + 0x1a0));
  return;
}

Assistant:

static void ppc_release(void *ctx)
{
    int i;
    TCGContext *tcg_ctx = (TCGContext *)ctx;
    PowerPCCPU *cpu = (PowerPCCPU *)tcg_ctx->uc->cpu;
    CPUPPCState *env = &cpu->env;
    CPUTLBDesc *d = cpu->neg.tlb.d;
    CPUTLBDescFast *f = cpu->neg.tlb.f;
    CPUTLBDesc *desc;
    CPUTLBDescFast *fast;

    release_common(ctx);
    for (i = 0; i < NB_MMU_MODES; i++) {
        desc = &(d[i]);
        fast = &(f[i]);
        g_free(desc->iotlb);
        g_free(fast->table);
    }

    for (i = 0; i < 32; i++) {
        g_free(tcg_ctx->cpu_gpr[i]);
    }
    //    g_free(tcg_ctx->cpu_PC);
    g_free(tcg_ctx->btarget);
    g_free(tcg_ctx->bcond);
    g_free(tcg_ctx->cpu_dspctrl);

    //    g_free(tcg_ctx->tb_ctx.tbs);

    if (env->nb_tlb != 0) {
        switch (env->tlb_type) {
        case TLB_6XX:
            g_free(env->tlb.tlb6);
            break;
        case TLB_EMB:
            g_free(env->tlb.tlbe);
            break;
        case TLB_MAS:
            g_free(env->tlb.tlbm);
            break;
        }
    }

    ppc_cpu_instance_finalize(tcg_ctx->uc->cpu);
    ppc_cpu_unrealize(tcg_ctx->uc->cpu);
}